

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_file.cpp
# Opt level: O1

void __thiscall
ApiLayerManifestFile::PopulateApiLayerProperties
          (ApiLayerManifestFile *this,XrApiLayerProperties *props)

{
  props->layerVersion = this->_implementation_version;
  props->specVersion =
       (ulong)(this->_api_version).patch |
       (ulong)(ushort)(this->_api_version).minor << 0x20 | (ulong)(this->_api_version).major << 0x30
  ;
  strncpy(props->layerName,(this->_layer_name)._M_dataplus._M_p,0xff);
  if (0xfe < (this->_layer_name)._M_string_length) {
    props->layerName[0xff] = '\0';
  }
  strncpy(props->description,(this->_description)._M_dataplus._M_p,0xff);
  if (0xfe < (this->_description)._M_string_length) {
    props->description[0xff] = '\0';
  }
  return;
}

Assistant:

void ApiLayerManifestFile::PopulateApiLayerProperties(XrApiLayerProperties &props) const {
    props.layerVersion = _implementation_version;
    props.specVersion = XR_MAKE_VERSION(_api_version.major, _api_version.minor, _api_version.patch);
    strncpy(props.layerName, _layer_name.c_str(), XR_MAX_API_LAYER_NAME_SIZE - 1);
    if (_layer_name.size() >= XR_MAX_API_LAYER_NAME_SIZE - 1) {
        props.layerName[XR_MAX_API_LAYER_NAME_SIZE - 1] = '\0';
    }
    strncpy(props.description, _description.c_str(), XR_MAX_API_LAYER_DESCRIPTION_SIZE - 1);
    if (_description.size() >= XR_MAX_API_LAYER_DESCRIPTION_SIZE - 1) {
        props.description[XR_MAX_API_LAYER_DESCRIPTION_SIZE - 1] = '\0';
    }
}